

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::AddAnimationBoneTrafoKey_3DGS_MDL7
          (MDLImporter *this,uint iTrafo,BoneTransform_MDL7 *pcBoneTransforms,
          IntBone_MDL7 **apcBonesOut)

{
  pointer *ppaVar1;
  pointer *ppaVar2;
  IntBone_MDL7 *pIVar3;
  iterator iVar4;
  iterator __position;
  aiVectorKey vPosition;
  aiVectorKey vScaling;
  aiQuatKey qRotation;
  aiMatrix4x4 mTransform;
  aiVectorKey local_c8;
  aiVectorKey local_a8;
  aiQuatKey local_88;
  aiMatrix4x4t<float> local_70;
  
  if (pcBoneTransforms == (BoneTransform_MDL7 *)0x0) {
    __assert_fail("__null != pcBoneTransforms",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x6ec,
                  "void Assimp::MDLImporter::AddAnimationBoneTrafoKey_3DGS_MDL7(unsigned int, const MDL::BoneTransform_MDL7 *, MDL::IntBone_MDL7 **)"
                 );
  }
  if (apcBonesOut != (IntBone_MDL7 **)0x0) {
    local_70.d4 = 1.0;
    local_70.a1 = pcBoneTransforms->m[0];
    local_70._12_8_ = (ulong)(uint)pcBoneTransforms->m[1] << 0x20;
    local_70._44_8_ = (ulong)(uint)pcBoneTransforms->m[3] << 0x20;
    local_70.b2 = pcBoneTransforms->m[5];
    local_70.c2 = pcBoneTransforms->m[6];
    local_70.c1 = pcBoneTransforms->m[2];
    local_70.a3 = pcBoneTransforms->m[8];
    local_70.a2 = pcBoneTransforms->m[4];
    local_70.b4 = 0.0;
    local_70.b3 = pcBoneTransforms->m[9];
    local_70.c3 = pcBoneTransforms->m[10];
    local_70.d3 = pcBoneTransforms->m[0xb];
    local_70.d2 = pcBoneTransforms->m[7];
    local_a8.mValue.z = 0.0;
    local_a8.mTime = 0.0;
    local_a8.mValue.x = 0.0;
    local_a8.mValue.y = 0.0;
    local_c8.mValue.z = 0.0;
    local_c8.mTime = 0.0;
    local_c8.mValue.x = 0.0;
    local_c8.mValue.y = 0.0;
    local_88.mTime = 0.0;
    local_88.mValue.w = 1.0;
    local_88.mValue.x = 0.0;
    local_88.mValue.y = 0.0;
    local_88.mValue.z = 0.0;
    aiMatrix4x4t<float>::Decompose(&local_70,&local_a8.mValue,&local_88.mValue,&local_c8.mValue);
    local_c8.mTime = (double)iTrafo;
    pIVar3 = apcBonesOut[pcBoneTransforms->bone_index];
    iVar4._M_current =
         (pIVar3->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_a8.mTime = local_c8.mTime;
    local_88.mTime = local_c8.mTime;
    if (iVar4._M_current ==
        (pIVar3->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVectorKey,std::allocator<aiVectorKey>>::_M_realloc_insert<aiVectorKey_const&>
                ((vector<aiVectorKey,std::allocator<aiVectorKey>> *)&pIVar3->pkeyPositions,iVar4,
                 &local_c8);
    }
    else {
      *(ulong *)&((iVar4._M_current)->mValue).z = CONCAT44(local_c8._20_4_,local_c8.mValue.z);
      (iVar4._M_current)->mTime = local_c8.mTime;
      ((iVar4._M_current)->mValue).x = local_c8.mValue.x;
      ((iVar4._M_current)->mValue).y = local_c8.mValue.y;
      ppaVar1 = &(pIVar3->pkeyPositions).
                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar4._M_current =
         (pIVar3->pkeyScalings).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pIVar3->pkeyScalings).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVectorKey,std::allocator<aiVectorKey>>::_M_realloc_insert<aiVectorKey_const&>
                ((vector<aiVectorKey,std::allocator<aiVectorKey>> *)&pIVar3->pkeyScalings,iVar4,
                 &local_a8);
    }
    else {
      *(ulong *)&((iVar4._M_current)->mValue).z = CONCAT44(local_a8._20_4_,local_a8.mValue.z);
      (iVar4._M_current)->mTime = local_a8.mTime;
      ((iVar4._M_current)->mValue).x = local_a8.mValue.x;
      ((iVar4._M_current)->mValue).y = local_a8.mValue.y;
      ppaVar1 = &(pIVar3->pkeyScalings).
                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    __position._M_current =
         (pIVar3->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pIVar3->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiQuatKey,std::allocator<aiQuatKey>>::_M_realloc_insert<aiQuatKey_const&>
                ((vector<aiQuatKey,std::allocator<aiQuatKey>> *)&pIVar3->pkeyRotations,__position,
                 &local_88);
    }
    else {
      ((__position._M_current)->mValue).y = local_88.mValue.y;
      ((__position._M_current)->mValue).z = local_88.mValue.z;
      (__position._M_current)->mTime = local_88.mTime;
      ((__position._M_current)->mValue).w = local_88.mValue.w;
      ((__position._M_current)->mValue).x = local_88.mValue.x;
      ppaVar2 = &(pIVar3->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
    }
    return;
  }
  __assert_fail("__null != apcBonesOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x6ed,
                "void Assimp::MDLImporter::AddAnimationBoneTrafoKey_3DGS_MDL7(unsigned int, const MDL::BoneTransform_MDL7 *, MDL::IntBone_MDL7 **)"
               );
}

Assistant:

void MDLImporter::AddAnimationBoneTrafoKey_3DGS_MDL7(unsigned int iTrafo,
    const MDL::BoneTransform_MDL7* pcBoneTransforms,
    MDL::IntBone_MDL7** apcBonesOut)
{
    ai_assert(NULL != pcBoneTransforms);
    ai_assert(NULL != apcBonesOut);

    // first .. get the transformation matrix
    aiMatrix4x4 mTransform;
    mTransform.a1 = pcBoneTransforms->m[0];
    mTransform.b1 = pcBoneTransforms->m[1];
    mTransform.c1 = pcBoneTransforms->m[2];
    mTransform.d1 = pcBoneTransforms->m[3];

    mTransform.a2 = pcBoneTransforms->m[4];
    mTransform.b2 = pcBoneTransforms->m[5];
    mTransform.c2 = pcBoneTransforms->m[6];
    mTransform.d2 = pcBoneTransforms->m[7];

    mTransform.a3 = pcBoneTransforms->m[8];
    mTransform.b3 = pcBoneTransforms->m[9];
    mTransform.c3 = pcBoneTransforms->m[10];
    mTransform.d3 = pcBoneTransforms->m[11];

    // now decompose the transformation matrix into separate
    // scaling, rotation and translation
    aiVectorKey vScaling,vPosition;
    aiQuatKey qRotation;

    // FIXME: Decompose will assert in debug builds if the matrix is invalid ...
    mTransform.Decompose(vScaling.mValue,qRotation.mValue,vPosition.mValue);

    // now generate keys
    vScaling.mTime = qRotation.mTime = vPosition.mTime = (double)iTrafo;

    // add the keys to the bone
    MDL::IntBone_MDL7* const pcBoneOut = apcBonesOut[pcBoneTransforms->bone_index];
    pcBoneOut->pkeyPositions.push_back  ( vPosition );
    pcBoneOut->pkeyScalings.push_back   ( vScaling  );
    pcBoneOut->pkeyRotations.push_back  ( qRotation );
}